

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O1

Mat R_x(double Angle)

{
  double dVar1;
  double dVar2;
  undefined8 *puVar3;
  double *extraout_RDX;
  undefined8 *in_RDI;
  Mat MVar4;
  undefined4 local_28;
  undefined4 uStack_24;
  
  dVar1 = cos(Angle);
  dVar2 = sin(Angle);
  *in_RDI = 0x300000003;
  puVar3 = (undefined8 *)operator_new__(0x48);
  in_RDI[1] = puVar3;
  *puVar3 = 0x3ff0000000000000;
  puVar3[3] = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[4] = dVar1;
  local_28 = SUB84(dVar2,0);
  uStack_24 = (undefined4)((ulong)dVar2 >> 0x20);
  *(undefined4 *)(puVar3 + 5) = local_28;
  *(undefined4 *)((long)puVar3 + 0x2c) = uStack_24;
  puVar3[6] = 0;
  puVar3[7] = -dVar2;
  puVar3[8] = dVar1;
  MVar4.v_ = extraout_RDX;
  MVar4._0_8_ = in_RDI;
  return MVar4;
}

Assistant:

Mat R_x(double Angle)
{
	const double C = cos(Angle);
	const double S = sin(Angle);
	Mat U(3,3);
	U.v_[0] = 1.0;
	U.v_[1] = 0.0;
	U.v_[2] = 0.0;
	U.v_[3] = 0.0;
	U.v_[4] =  +C;
	U.v_[5] =  +S;
	U.v_[6] = 0.0;
	U.v_[7] =  -S;
	U.v_[8] =  +C;
	return U;
}